

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O3

bool testMethod_substr_AtStartOwned(void)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  String local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testMethod_substr_AtStartOwned()\n",0x21);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"abc","");
  cm::String::String<std::__cxx11::string,void>(&local_30,&local_50);
  bVar1 = testMethod_substr_AtStart(&local_30);
  if (local_30.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}